

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::node::get_item
          (node *this,sha1_hash *target,function<void_(const_libtorrent::dht::item_&)> *f)

{
  dht_observer *pdVar1;
  function<void_(const_libtorrent::dht::item_&)> *__args_2;
  uint uVar2;
  undefined8 uVar3;
  element_type *peVar4;
  difference_type in_RCX;
  span<const_char> in;
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_b8;
  _Bind<std::function<void_(const_libtorrent::dht::item_&)>_(std::_Placeholder<1>)> local_98;
  undefined1 local_70 [8];
  shared_ptr<libtorrent::dht::get_item> ta;
  span<char_const> local_50 [16];
  string local_40;
  _Base_ptr local_20;
  function<void_(const_libtorrent::dht::item_&)> *f_local;
  sha1_hash *target_local;
  node *this_local;
  
  local_20 = (_Base_ptr)f;
  f_local = (function<void_(const_libtorrent::dht::item_&)> *)target;
  target_local = (sha1_hash *)this;
  if ((this->m_observer != (dht_observer *)0x0) &&
     (uVar2 = (**(this->m_observer->super_dht_logger)._vptr_dht_logger)(this->m_observer,1),
     (uVar2 & 1) != 0)) {
    pdVar1 = this->m_observer;
    span<char_const>::span<libtorrent::digest32<160l>,char,void>(local_50,(digest32<160L> *)f_local)
    ;
    in.m_len = in_RCX;
    in.m_ptr = (char *)local_50._8_8_;
    libtorrent::aux::to_hex_abi_cxx11_(&local_40,(aux *)local_50._0_8_,in);
    uVar3 = ::std::__cxx11::string::c_str();
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,1,"starting get for [ hash: %s ]",uVar3);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  __args_2 = f_local;
  ::std::bind<std::function<void(libtorrent::dht::item_const&)>&,std::_Placeholder<1>const&>
            ((type *)&local_98,f,(_Placeholder<1> *)&::std::placeholders::_1);
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(&local_b8);
  ::std::
  make_shared<libtorrent::dht::get_item,libtorrent::dht::node&,libtorrent::digest32<160l>const&,std::_Bind<std::function<void(libtorrent::dht::item_const&)>(std::_Placeholder<1>)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            ((node *)local_70,(digest32<160L> *)this,
             (_Bind<std::function<void_(const_libtorrent::dht::item_&)>_(std::_Placeholder<1>)> *)
             __args_2,(function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                       *)&local_98);
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::~function(&local_b8);
  ::std::_Bind<std::function<void_(const_libtorrent::dht::item_&)>_(std::_Placeholder<1>)>::~_Bind
            (&local_98);
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
  (*(peVar4->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  ::std::shared_ptr<libtorrent::dht::get_item>::~shared_ptr
            ((shared_ptr<libtorrent::dht::get_item> *)local_70);
  return;
}

Assistant:

void node::get_item(sha1_hash const& target, std::function<void(item const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "starting get for [ hash: %s ]"
			, aux::to_hex(target).c_str());
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, target
		, std::bind(f, _1), find_data::nodes_callback());
	ta->start();
}